

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
libcellml::Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode(GeneratorImpl *this)

{
  size_type sVar1;
  bool bVar2;
  string interfaceVoiStateAndVariableInfoCode;
  string local_50;
  undefined1 *local_30;
  long local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  bVar2 = modelHasOdes(this);
  if (bVar2) {
    GeneratorProfile::interfaceVoiInfoString_abi_cxx11_
              (&local_50,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar1 = local_50._M_string_length;
    std::__cxx11::string::~string((string *)&local_50);
    if (sVar1 != 0) {
      GeneratorProfile::interfaceVoiInfoString_abi_cxx11_
                (&local_50,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      std::__cxx11::string::append((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  bVar2 = modelHasOdes(this);
  if (bVar2) {
    GeneratorProfile::interfaceStateInfoString_abi_cxx11_
              (&local_50,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar1 = local_50._M_string_length;
    std::__cxx11::string::~string((string *)&local_50);
    if (sVar1 != 0) {
      GeneratorProfile::interfaceStateInfoString_abi_cxx11_
                (&local_50,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      std::__cxx11::string::append((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_
            (&local_50,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_50._M_string_length != 0) {
    GeneratorProfile::interfaceVariableInfoString_abi_cxx11_
              (&local_50,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::append((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (local_28 != 0) {
    std::__cxx11::string::append((char *)&this->mCode);
  }
  std::__cxx11::string::append((string *)&this->mCode);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode()
{
    std::string interfaceVoiStateAndVariableInfoCode;

    if (modelHasOdes()
        && !mProfile->interfaceVoiInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVoiInfoString();
    }

    if (modelHasOdes()
        && !mProfile->interfaceStateInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceStateInfoString();
    }

    if (!mProfile->interfaceVariableInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVariableInfoString();
    }

    if (!interfaceVoiStateAndVariableInfoCode.empty()) {
        mCode += "\n";
    }

    mCode += interfaceVoiStateAndVariableInfoCode;
}